

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O2

int __thiscall
cmCTestBuildAndTestHandler::RunCMakeAndTest(cmCTestBuildAndTestHandler *this,string *outstring)

{
  string *psVar1;
  string *projectName;
  cmCTest *pcVar2;
  pointer pcVar3;
  cmCTestBuildAndTestHandler *pcVar4;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> this_00;
  bool bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  string *psVar9;
  ostream *poVar10;
  long lVar11;
  char *pcVar12;
  string *makeCommandCSTR;
  long lVar13;
  string *psVar14;
  string *fail;
  pointer pbVar15;
  pointer pbVar16;
  string *testCommandArg;
  cmDuration testTimeOut;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int retval;
  cmCTestBuildAndTestHandler *local_13c0;
  string tempPath;
  undefined1 local_1390 [8];
  string outs;
  string fullPath;
  _Alloc_hider local_1330;
  string resultingConfig;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraPaths;
  pointer local_12e8;
  cmCTestBuildAndTestCaptureRAII captureRAII;
  vector<const_char_*,_std::allocator<const_char_*>_> testCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  failed;
  cmWorkingDirectory workdir;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_1250;
  string cmakeOutString;
  ostringstream out;
  string fullPath_1;
  cmake cm;
  
  if ((this->BuildGenerator)._M_string_length == 0) {
    if (outstring == (string *)0x0) {
      return 1;
    }
    std::__cxx11::string::assign((char *)outstring);
    return 1;
  }
  iVar8 = 1;
  cmake::cmake(&cm,RoleProject,Project,Normal);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullPath_1,"",(allocator<char> *)&out);
  cmake::SetHomeDirectory(&cm,&fullPath_1);
  std::__cxx11::string::~string((string *)&fullPath_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullPath_1,"",(allocator<char> *)&out);
  cmake::SetHomeOutputDirectory(&cm,&fullPath_1);
  std::__cxx11::string::~string((string *)&fullPath_1);
  cmakeOutString._M_dataplus._M_p = (pointer)&cmakeOutString.field_2;
  cmakeOutString._M_string_length = 0;
  cmakeOutString.field_2._M_local_buf[0] = '\0';
  cmCTestBuildAndTestCaptureRAII::cmCTestBuildAndTestCaptureRAII(&captureRAII,&cm,&cmakeOutString);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  psVar9 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  if ((psVar9->_M_string_length == 0) && ((this->ConfigSample)._M_string_length != 0)) {
    fullPath_1._M_dataplus._M_p = (pointer)&fullPath_1.field_2;
    fullPath_1._M_string_length = 0;
    fullPath_1.field_2._M_local_buf[0] = '\0';
    outs._M_dataplus._M_p = (pointer)&outs.field_2;
    outs._M_string_length = 0;
    outs.field_2._M_allocated_capacity = outs.field_2._M_allocated_capacity & 0xffffffffffffff00;
    fullPath.field_2._M_allocated_capacity = 0;
    fullPath._M_dataplus._M_p = (pointer)0x0;
    fullPath._M_string_length = 0;
    resultingConfig._M_dataplus._M_p = (pointer)0x0;
    resultingConfig._M_string_length = 0;
    resultingConfig.field_2._M_allocated_capacity = 0;
    cmCTestTestHandler::FindExecutable
              (&workdir.OldDir,(this->super_cmCTestGenericHandler).CTest,&this->ConfigSample,&outs,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&fullPath,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&resultingConfig);
    std::__cxx11::string::operator=((string *)&fullPath_1,(string *)&workdir);
    std::__cxx11::string::~string((string *)&workdir);
    if ((fullPath_1._M_string_length != 0) && (outs._M_string_length != 0)) {
      cmCTest::SetConfigType((this->super_cmCTestGenericHandler).CTest,&outs);
    }
    poVar10 = std::operator<<((ostream *)&out,"Using config sample with results: ");
    poVar10 = std::operator<<(poVar10,(string *)&fullPath_1);
    poVar10 = std::operator<<(poVar10," and ");
    poVar10 = std::operator<<(poVar10,(string *)&outs);
    std::endl<char,std::char_traits<char>>(poVar10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&resultingConfig);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&fullPath);
    std::__cxx11::string::~string((string *)&outs);
    std::__cxx11::string::~string((string *)&fullPath_1);
  }
  lVar11 = std::chrono::_V2::steady_clock::now();
  poVar10 = std::operator<<((ostream *)&out,"Internal cmake changing into directory: ");
  psVar9 = &this->BinaryDir;
  poVar10 = std::operator<<(poVar10,(string *)psVar9);
  std::endl<char,std::char_traits<char>>(poVar10);
  bVar5 = cmsys::SystemTools::FileIsDirectory(psVar9);
  if (!bVar5) {
    cmsys::SystemTools::MakeDirectory(psVar9,(mode_t *)0x0);
  }
  cmWorkingDirectory::cmWorkingDirectory(&workdir,psVar9);
  if (workdir.ResultCode == 0) {
    local_13c0 = this;
    if (this->BuildNoCMake == true) {
      iVar8 = 1;
      cmake::CreateGlobalGenerator((cmake *)local_1390,(string *)&cm,(bool)((char)this + '@'));
      cmake::SetGlobalGenerator
                (&cm,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                     local_1390);
      if ((_Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)local_1390
          != (cmGlobalGenerator *)0x0) {
        (**(code **)((long)*(__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                             *)local_1390 + 8))();
      }
      local_1390 = (undefined1  [8])0x0;
      if ((local_13c0->BuildGeneratorPlatform)._M_string_length != 0) {
        outs.field_2._M_allocated_capacity = cm.CurrentSnapshot.Position.Position;
        outs._M_dataplus._M_p = (pointer)cm.CurrentSnapshot.State;
        outs._M_string_length = (size_type)cm.CurrentSnapshot.Position.Tree;
        cmMakefile::cmMakefile
                  ((cmMakefile *)&fullPath_1,
                   (cmGlobalGenerator *)
                   cm.GlobalGenerator._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                   (cmStateSnapshot *)&outs);
        cVar6 = (**(code **)(*(long *)cm.GlobalGenerator._M_t.
                                      super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                                      .super__Head_base<0UL,_cmGlobalGenerator_*,_false>.
                                      _M_head_impl + 0x48))
                          (cm.GlobalGenerator._M_t.
                           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                           .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                           &local_13c0->BuildGeneratorPlatform,&fullPath_1);
        cmMakefile::~cmMakefile((cmMakefile *)&fullPath_1);
        if (cVar6 == '\0') goto LAB_00167f13;
      }
      cmake::LoadCache(&cm,psVar9);
    }
    else {
      iVar7 = RunCMake(this,outstring,&out,&cmakeOutString,&cm);
      if (iVar7 != 0) goto LAB_00167f13;
    }
    pbVar16 = (local_13c0->BuildTargets).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_12e8 = (local_13c0->BuildTargets).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar16 == local_12e8) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&local_13c0->BuildTargets);
      pbVar16 = (local_13c0->BuildTargets).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_12e8 = (local_13c0->BuildTargets).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    }
    psVar1 = &local_13c0->SourceDir;
    projectName = &local_13c0->BuildProject;
    makeCommandCSTR = &local_13c0->BuildMakeProgram;
    do {
      pcVar4 = local_13c0;
      if (pbVar16 == local_12e8) {
        if (outstring != (string *)0x0) {
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)outstring,(string *)&fullPath_1);
          std::__cxx11::string::~string((string *)&fullPath_1);
        }
        if ((pcVar4->TestCommand)._M_string_length != 0) {
          fullPath._M_dataplus._M_p = (pointer)&fullPath.field_2;
          fullPath._M_string_length = 0;
          psVar9 = &pcVar4->TestCommand;
          fullPath.field_2._M_allocated_capacity =
               fullPath.field_2._M_allocated_capacity & 0xffffffffffffff00;
          resultingConfig._M_dataplus._M_p = (pointer)&resultingConfig.field_2;
          resultingConfig._M_string_length = 0;
          resultingConfig.field_2._M_allocated_capacity =
               resultingConfig.field_2._M_allocated_capacity & 0xffffffffffffff00;
          extraPaths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          extraPaths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          extraPaths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          pcVar3 = (pointer)(pcVar4->ExecutableDirectory)._M_string_length;
          if (pcVar3 != (pointer)0x0) {
            fullPath_1._M_string_length = (size_type)(pcVar4->ExecutableDirectory)._M_dataplus._M_p;
            outs._M_string_length = (size_type)&outs.field_2;
            outs._M_dataplus._M_p = &DAT_00000001;
            outs.field_2._M_local_buf[0] = 0x2f;
            fullPath_1._M_dataplus._M_p = pcVar3;
            cmStrCat<std::__cxx11::string>
                      (&tempPath,(cmAlphaNum *)&fullPath_1,(cmAlphaNum *)&outs,psVar9);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&extraPaths,&tempPath);
            std::__cxx11::string::~string((string *)&tempPath);
          }
          failed.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          failed.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          failed.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmCTestTestHandler::FindExecutable
                    (&fullPath_1,(pcVar4->super_cmCTestGenericHandler).CTest,psVar9,&resultingConfig
                     ,&extraPaths,&failed);
          std::__cxx11::string::operator=((string *)&fullPath,(string *)&fullPath_1);
          std::__cxx11::string::~string((string *)&fullPath_1);
          bVar5 = cmsys::SystemTools::FileExists(&fullPath);
          if (bVar5) {
            testCommand.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            testCommand.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            testCommand.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            fullPath_1._M_dataplus = fullPath._M_dataplus;
            std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                      ((vector<char_const*,std::allocator<char_const*>> *)&testCommand,
                       (char **)&fullPath_1);
            pbVar15 = (pcVar4->TestCommandArgs).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar16 = (pcVar4->TestCommandArgs).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar16 != pbVar15;
                pbVar16 = pbVar16 + 1) {
              fullPath_1._M_dataplus._M_p = (pbVar16->_M_dataplus)._M_p;
              std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                        ((vector<char_const*,std::allocator<char_const*>> *)&testCommand,
                         (char **)&fullPath_1);
            }
            fullPath_1._M_dataplus._M_p = (pointer)0x0;
            std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                      ((vector<char_const*,std::allocator<char_const*>> *)&testCommand,
                       (char **)&fullPath_1);
            outs._M_dataplus._M_p = (pointer)&outs.field_2;
            outs._M_string_length = 0;
            retval = 0;
            outs.field_2._M_allocated_capacity =
                 outs.field_2._M_allocated_capacity & 0xffffffffffffff00;
            if ((pcVar4->BuildRunDir)._M_string_length == 0) {
LAB_00168587:
              poVar10 = std::operator<<((ostream *)&out,"Running test command: \"");
              poVar10 = std::operator<<(poVar10,(string *)&fullPath);
              std::operator<<(poVar10,"\"");
              pbVar15 = (pcVar4->TestCommandArgs).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar16 = (pcVar4->TestCommandArgs).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; pbVar16 != pbVar15;
                  pbVar16 = pbVar16 + 1) {
                poVar10 = std::operator<<((ostream *)&out," \"");
                poVar10 = std::operator<<(poVar10,(string *)pbVar16);
                std::operator<<(poVar10,"\"");
              }
              std::operator<<((ostream *)&out,"\n");
              testTimeOut.__r = 0.0;
              if (0.0 < (pcVar4->Timeout).__r) {
                lVar13 = std::chrono::_V2::steady_clock::now();
                testTimeOut.__r =
                     ((pcVar4->Timeout).__r * 1000000000.0 - (double)(lVar13 - lVar11)) /
                     1000000000.0;
                if (testTimeOut.__r <= 0.0) {
                  iVar8 = 1;
                  if (outstring != (string *)0x0) {
                    std::__cxx11::string::assign((char *)outstring);
                  }
                  goto LAB_00168a0e;
                }
              }
              pcVar2 = (pcVar4->super_cmCTestGenericHandler).CTest;
              std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_1250,
                         &testCommand);
              iVar8 = cmCTest::RunTest(pcVar2,(vector<const_char_*,_std::allocator<const_char_*>_> *
                                              )&local_1250,&outs,&retval,(ostream *)0x0,testTimeOut,
                                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)0x0,Auto);
              std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                        (&local_1250);
              if ((iVar8 != 4) || (retval != 0)) {
                poVar10 = std::operator<<((ostream *)&out,"Test command failed: ");
                poVar10 = std::operator<<(poVar10,*testCommand.
                                                                                                      
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                std::operator<<(poVar10,"\n");
                retval = 1;
              }
              poVar10 = std::operator<<((ostream *)&out,(string *)&outs);
              std::operator<<(poVar10,"\n");
              if (outstring == (string *)0x0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullPath_1);
                std::__cxx11::stringbuf::str();
                poVar10 = std::operator<<((ostream *)&fullPath_1,(string *)&tempPath);
                std::endl<char,std::char_traits<char>>(poVar10);
                std::__cxx11::string::~string((string *)&tempPath);
                pcVar2 = (pcVar4->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar2,1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                             ,0x178,tempPath._M_dataplus._M_p,false);
                std::__cxx11::string::~string((string *)&tempPath);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullPath_1);
                iVar8 = retval;
              }
              else {
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::operator=((string *)outstring,(string *)&fullPath_1);
                std::__cxx11::string::~string((string *)&fullPath_1);
                iVar8 = retval;
              }
            }
            else {
              poVar10 = std::operator<<((ostream *)&out,"Run test in directory: ");
              poVar10 = std::operator<<(poVar10,(string *)&pcVar4->BuildRunDir);
              std::operator<<(poVar10,"\n");
              bVar5 = cmWorkingDirectory::SetDirectory(&workdir,&pcVar4->BuildRunDir);
              if (bVar5) goto LAB_00168587;
              poVar10 = std::operator<<((ostream *)&out,"Failed to change working directory : ");
              pcVar12 = strerror(workdir.ResultCode);
              poVar10 = std::operator<<(poVar10,pcVar12);
              std::operator<<(poVar10,"\n");
              if (outstring == (string *)0x0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullPath_1);
                std::__cxx11::stringbuf::str();
                std::operator<<((ostream *)&fullPath_1,(string *)&tempPath);
                std::__cxx11::string::~string((string *)&tempPath);
                pcVar2 = (pcVar4->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar2,7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                             ,0x154,tempPath._M_dataplus._M_p,false);
                std::__cxx11::string::~string((string *)&tempPath);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullPath_1);
              }
              else {
                std::__cxx11::stringbuf::str();
                std::__cxx11::string::operator=((string *)outstring,(string *)&fullPath_1);
                std::__cxx11::string::~string((string *)&fullPath_1);
              }
              iVar8 = 1;
            }
LAB_00168a0e:
            std::__cxx11::string::~string((string *)&outs);
            std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                      (&testCommand.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
            ;
          }
          else {
            poVar10 = std::operator<<((ostream *)&out,
                                      "Could not find path to executable, perhaps it was not built: "
                                     );
            poVar10 = std::operator<<(poVar10,(string *)psVar9);
            std::operator<<(poVar10,"\n");
            std::operator<<((ostream *)&out,"tried to find it in these places:\n");
            poVar10 = std::operator<<((ostream *)&out,(string *)&fullPath);
            std::operator<<(poVar10,"\n");
            pbVar16 = failed.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar15 = failed.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar16;
                pbVar15 = pbVar15 + 1) {
              poVar10 = std::operator<<((ostream *)&out,(string *)pbVar15);
              std::operator<<(poVar10,"\n");
            }
            if (outstring == (string *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullPath_1);
              std::__cxx11::stringbuf::str();
              std::operator<<((ostream *)&fullPath_1,(string *)&outs);
              std::__cxx11::string::~string((string *)&outs);
              pcVar2 = (pcVar4->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar2,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                           ,0x13e,outs._M_dataplus._M_p,false);
              std::__cxx11::string::~string((string *)&outs);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullPath_1);
            }
            else {
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::operator=((string *)outstring,(string *)&fullPath_1);
              std::__cxx11::string::~string((string *)&fullPath_1);
            }
            iVar8 = 1;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&failed);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&extraPaths);
          std::__cxx11::string::~string((string *)&resultingConfig);
          psVar9 = &fullPath;
          goto LAB_00167f0e;
        }
        iVar8 = 0;
        goto LAB_00167f13;
      }
      local_1330._M_p = (pointer)0x0;
      if (0.0 < (local_13c0->Timeout).__r) {
        lVar13 = std::chrono::_V2::steady_clock::now();
        local_1330._M_p =
             (pointer)(((pcVar4->Timeout).__r * 1000000000.0 - (double)(lVar13 - lVar11)) /
                      1000000000.0);
        if (0.0 < (double)local_1330._M_p) goto LAB_00168090;
        if (outstring != (string *)0x0) {
          std::__cxx11::string::assign((char *)outstring);
          iVar8 = 1;
          goto LAB_00167f13;
        }
        break;
      }
LAB_00168090:
      fullPath_1._M_dataplus._M_p = (pointer)&fullPath_1.field_2;
      fullPath_1._M_string_length = 0;
      fullPath_1.field_2._M_local_buf[0] = '\0';
      psVar14 = cmCTest::GetConfigType_abi_cxx11_((pcVar4->super_cmCTestGenericHandler).CTest);
      if (psVar14->_M_string_length == 0) {
        pcVar12 = (pointer)0x0;
      }
      else {
        psVar14 = cmCTest::GetConfigType_abi_cxx11_((local_13c0->super_cmCTestGenericHandler).CTest)
        ;
        pcVar12 = (psVar14->_M_dataplus)._M_p;
      }
      this_00._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
      ._M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
           cm.GlobalGenerator._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      pbVar15 = extraPaths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pcVar12 == (pointer)0x0) {
        pcVar12 = "Debug";
      }
      extraPaths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._2_6_ = SUB86(pbVar15,2);
      extraPaths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_2_ = CONCAT11(0,local_13c0->BuildNoClean ^ 1);
      extraPaths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(3,extraPaths.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_4_);
      std::__cxx11::string::string((string *)&outs,(string *)pbVar16);
      __l._M_len = 1;
      __l._M_array = &outs;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&resultingConfig,__l,(allocator_type *)&failed);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fullPath,pcVar12,(allocator<char> *)&testCommand);
      tempPath._M_dataplus._M_p = (pointer)0x0;
      tempPath._M_string_length = 0;
      tempPath.field_2._M_allocated_capacity = 0;
      iVar8 = cmGlobalGenerator::Build
                        ((cmGlobalGenerator *)
                         this_00._M_t.
                         super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                         .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,-1,psVar1,
                         psVar9,projectName,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&resultingConfig,&fullPath_1,makeCommandCSTR,&fullPath,
                         (cmBuildOptions *)&extraPaths,false,(cmDuration)local_1330._M_p,OUTPUT_NONE
                         ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&tempPath);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&tempPath);
      std::__cxx11::string::~string((string *)&fullPath);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&resultingConfig);
      std::__cxx11::string::~string((string *)&outs);
      std::operator<<((ostream *)&out,(string *)&fullPath_1);
      if ((outstring != (string *)0x0) && (iVar8 != 0)) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)outstring,(string *)&outs);
        std::__cxx11::string::~string((string *)&outs);
      }
      std::__cxx11::string::~string((string *)&fullPath_1);
      pbVar16 = pbVar16 + 1;
    } while (iVar8 == 0);
    iVar8 = 1;
  }
  else {
    std::operator+(&resultingConfig,"Failed to change working directory to ",psVar9);
    std::operator+(&fullPath,&resultingConfig," : ");
    pcVar12 = strerror(workdir.ResultCode);
    std::operator+(&fullPath_1,&fullPath,pcVar12);
    std::operator+(&outs,&fullPath_1,"\n");
    std::__cxx11::string::~string((string *)&fullPath_1);
    std::__cxx11::string::~string((string *)&fullPath);
    std::__cxx11::string::~string((string *)&resultingConfig);
    if (outstring == (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullPath_1);
      std::operator<<((ostream *)&fullPath_1,(string *)&outs);
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                   ,0xd5,fullPath._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&fullPath);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullPath_1);
    }
    else {
      std::__cxx11::string::_M_assign((string *)outstring);
    }
    psVar9 = &outs;
LAB_00167f0e:
    std::__cxx11::string::~string((string *)psVar9);
  }
LAB_00167f13:
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  cmCTestBuildAndTestCaptureRAII::~cmCTestBuildAndTestCaptureRAII(&captureRAII);
  std::__cxx11::string::~string((string *)&cmakeOutString);
  cmake::~cmake(&cm);
  return iVar8;
}

Assistant:

int cmCTestBuildAndTestHandler::RunCMakeAndTest(std::string* outstring)
{
  // if the generator and make program are not specified then it is an error
  if (this->BuildGenerator.empty()) {
    if (outstring) {
      *outstring = "--build-and-test requires that the generator "
                   "be provided using the --build-generator "
                   "command line option. ";
    }
    return 1;
  }

  cmake cm(cmake::RoleProject, cmState::Project);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  std::string cmakeOutString;
  cmCTestBuildAndTestCaptureRAII captureRAII(cm, cmakeOutString);
  static_cast<void>(captureRAII);
  std::ostringstream out;

  if (this->CTest->GetConfigType().empty() && !this->ConfigSample.empty()) {
    // use the config sample to set the ConfigType
    std::string fullPath;
    std::string resultingConfig;
    std::vector<std::string> extraPaths;
    std::vector<std::string> failed;
    fullPath = cmCTestTestHandler::FindExecutable(
      this->CTest, this->ConfigSample, resultingConfig, extraPaths, failed);
    if (!fullPath.empty() && !resultingConfig.empty()) {
      this->CTest->SetConfigType(resultingConfig);
    }
    out << "Using config sample with results: " << fullPath << " and "
        << resultingConfig << std::endl;
  }

  // we need to honor the timeout specified, the timeout include cmake, build
  // and test time
  auto clock_start = std::chrono::steady_clock::now();

  // make sure the binary dir is there
  out << "Internal cmake changing into directory: " << this->BinaryDir
      << std::endl;
  if (!cmSystemTools::FileIsDirectory(this->BinaryDir)) {
    cmSystemTools::MakeDirectory(this->BinaryDir);
  }
  cmWorkingDirectory workdir(this->BinaryDir);
  if (workdir.Failed()) {
    auto msg = "Failed to change working directory to " + this->BinaryDir +
      " : " + std::strerror(workdir.GetLastResult()) + "\n";
    if (outstring) {
      *outstring = msg;
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE, msg);
    }
    return 1;
  }

  if (this->BuildNoCMake) {
    // Make the generator available for the Build call below.
    cm.SetGlobalGenerator(cm.CreateGlobalGenerator(this->BuildGenerator));
    if (!this->BuildGeneratorPlatform.empty()) {
      cmMakefile mf(cm.GetGlobalGenerator(), cm.GetCurrentSnapshot());
      if (!cm.GetGlobalGenerator()->SetGeneratorPlatform(
            this->BuildGeneratorPlatform, &mf)) {
        return 1;
      }
    }

    // Load the cache to make CMAKE_MAKE_PROGRAM available.
    cm.LoadCache(this->BinaryDir);
  } else {
    // do the cmake step, no timeout here since it is not a sub process
    if (this->RunCMake(outstring, out, cmakeOutString, &cm)) {
      return 1;
    }
  }

  // do the build
  if (this->BuildTargets.empty()) {
    this->BuildTargets.emplace_back();
  }
  for (std::string const& tar : this->BuildTargets) {
    cmDuration remainingTime = std::chrono::seconds(0);
    if (this->Timeout > cmDuration::zero()) {
      remainingTime =
        this->Timeout - (std::chrono::steady_clock::now() - clock_start);
      if (remainingTime <= std::chrono::seconds(0)) {
        if (outstring) {
          *outstring = "--build-and-test timeout exceeded. ";
        }
        return 1;
      }
    }
    std::string output;
    const char* config = nullptr;
    if (!this->CTest->GetConfigType().empty()) {
      config = this->CTest->GetConfigType().c_str();
    }
#ifdef CMAKE_INTDIR
    if (!config) {
      config = CMAKE_INTDIR;
    }
#endif
    if (!config) {
      config = "Debug";
    }

    cmBuildOptions buildOptions(!this->BuildNoClean, false,
                                PackageResolveMode::Disable);
    int retVal = cm.GetGlobalGenerator()->Build(
      cmake::NO_BUILD_PARALLEL_LEVEL, this->SourceDir, this->BinaryDir,
      this->BuildProject, { tar }, output, this->BuildMakeProgram, config,
      buildOptions, false, remainingTime);
    out << output;
    // if the build failed then return
    if (retVal) {
      if (outstring) {
        *outstring = out.str();
      }
      return 1;
    }
  }
  if (outstring) {
    *outstring = out.str();
  }

  // if no test was specified then we are done
  if (this->TestCommand.empty()) {
    return 0;
  }

  // now run the compiled test if we can find it
  // store the final location in fullPath
  std::string fullPath;
  std::string resultingConfig;
  std::vector<std::string> extraPaths;
  // if this->ExecutableDirectory is set try that as well
  if (!this->ExecutableDirectory.empty()) {
    std::string tempPath =
      cmStrCat(this->ExecutableDirectory, '/', this->TestCommand);
    extraPaths.push_back(tempPath);
  }
  std::vector<std::string> failed;
  fullPath = cmCTestTestHandler::FindExecutable(
    this->CTest, this->TestCommand, resultingConfig, extraPaths, failed);

  if (!cmSystemTools::FileExists(fullPath)) {
    out << "Could not find path to executable, perhaps it was not built: "
        << this->TestCommand << "\n";
    out << "tried to find it in these places:\n";
    out << fullPath << "\n";
    for (std::string const& fail : failed) {
      out << fail << "\n";
    }
    if (outstring) {
      *outstring = out.str();
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE, out.str());
    }
    return 1;
  }

  std::vector<const char*> testCommand;
  testCommand.push_back(fullPath.c_str());
  for (std::string const& testCommandArg : this->TestCommandArgs) {
    testCommand.push_back(testCommandArg.c_str());
  }
  testCommand.push_back(nullptr);
  std::string outs;
  int retval = 0;
  // run the test from the this->BuildRunDir if set
  if (!this->BuildRunDir.empty()) {
    out << "Run test in directory: " << this->BuildRunDir << "\n";
    if (!workdir.SetDirectory(this->BuildRunDir)) {
      out << "Failed to change working directory : "
          << std::strerror(workdir.GetLastResult()) << "\n";
      if (outstring) {
        *outstring = out.str();
      } else {
        cmCTestLog(this->CTest, ERROR_MESSAGE, out.str());
      }
      return 1;
    }
  }
  out << "Running test command: \"" << fullPath << "\"";
  for (std::string const& testCommandArg : this->TestCommandArgs) {
    out << " \"" << testCommandArg << "\"";
  }
  out << "\n";

  // how much time is remaining
  cmDuration remainingTime = std::chrono::seconds(0);
  if (this->Timeout > cmDuration::zero()) {
    remainingTime =
      this->Timeout - (std::chrono::steady_clock::now() - clock_start);
    if (remainingTime <= std::chrono::seconds(0)) {
      if (outstring) {
        *outstring = "--build-and-test timeout exceeded. ";
      }
      return 1;
    }
  }

  int runTestRes = this->CTest->RunTest(testCommand, &outs, &retval, nullptr,
                                        remainingTime, nullptr);

  if (runTestRes != cmsysProcess_State_Exited || retval != 0) {
    out << "Test command failed: " << testCommand[0] << "\n";
    retval = 1;
  }

  out << outs << "\n";
  if (outstring) {
    *outstring = out.str();
  } else {
    cmCTestLog(this->CTest, OUTPUT, out.str() << std::endl);
  }
  return retval;
}